

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O2

bool glcts::verifyImage<unsigned_int,1u>
               (GLuint image_width,GLuint image_height,uint *components,uint *image)

{
  uint uVar1;
  uint uVar2;
  GLuint y;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  for (uVar3 = 0; uVar5 = (ulong)image_width, uVar1 = uVar2, uVar3 != image_height;
      uVar3 = uVar3 + 1) {
    while( true ) {
      uVar4 = (ulong)uVar1;
      if (uVar5 == 0) break;
      uVar5 = uVar5 - 1;
      uVar1 = uVar1 + 1;
      if (image[uVar4] != *components) goto LAB_00d30bf5;
    }
    uVar2 = uVar2 + image_width;
  }
LAB_00d30bf5:
  return image_height <= uVar3;
}

Assistant:

bool verifyImage(glw::GLuint image_width, glw::GLuint image_height, const T* components, const T* image)
{
	const glw::GLuint line_size = image_width * N_Components;

	for (glw::GLuint y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * line_size;

		for (glw::GLuint x = 0; x < image_width; ++x)
		{
			const glw::GLuint pixel_offset = line_offset + x * N_Components;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (image[pixel_offset + component] != components[component])
				{
					return false;
				}
			} /* for (all components) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	return true;
}